

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O0

void set_socket_timeout(int socket_fd,timeval *timeout,Direction direction)

{
  int iVar1;
  int in_EDX;
  void *in_RSI;
  int in_EDI;
  int return_code;
  
  iVar1 = 0x14;
  if (in_EDX == 0) {
    iVar1 = 0x15;
  }
  iVar1 = setsockopt(in_EDI,1,iVar1,in_RSI,0x10);
  if (iVar1 == -1) {
    throw((char *)0x102db3);
  }
  return;
}

Assistant:

void set_socket_timeout(int socket_fd, timeval* timeout, Direction direction) {
	// clang-format off
	int return_code = setsockopt(
		socket_fd,
		SOL_SOCKET,
		(direction == SEND) ? SO_SNDTIMEO : SO_RCVTIMEO,
		timeout,
		sizeof *timeout
	);
	// clang-format on

	if (return_code == -1) {
		throw("Error setting blocking timeout");
	}
}